

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

bool goodform::json::deserialize(istream *input,any *v)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  _Ios_Openmode _Var4;
  byte local_241;
  void *local_228;
  bool local_21a;
  bool local_219;
  ulong local_218;
  uint64_t tmp_2;
  int64_t tmp_1;
  double tmp;
  stringstream ss;
  string local_70 [6];
  bool found_period;
  bool done;
  string str_number;
  bool is_signed;
  undefined1 local_40 [8];
  string s;
  char c;
  char drain [5];
  bool ret;
  any *v_local;
  istream *input_local;
  
  s.field_2._M_local_buf[0xf] = '\0';
  strip_white_space(input);
  s.field_2._M_local_buf[9] = std::istream::peek();
  if (s.field_2._M_local_buf[9] == '{') {
    s.field_2._M_local_buf[0xf] = parse_object(input,v);
  }
  else if (s.field_2._M_local_buf[9] == '[') {
    s.field_2._M_local_buf[0xf] = parse_array(input,v);
  }
  else if (s.field_2._M_local_buf[9] == '\"') {
    std::__cxx11::string::string((string *)local_40);
    s.field_2._M_local_buf[0xf] = read_string(input,(string *)local_40);
    std::any::operator=(v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    iVar3 = isdigit((int)s.field_2._M_local_buf[9]);
    if ((iVar3 == 0) && (s.field_2._M_local_buf[9] != '-')) {
      if ((s.field_2._M_local_buf[9] == 't') || (s.field_2._M_local_buf[9] == 'T')) {
        std::istream::read((char *)input,(long)((long)&s.field_2 + 10));
        local_219 = true;
        std::any::operator=(v,&local_219);
        s.field_2._M_local_buf[0xf] = '\x01';
      }
      else if ((s.field_2._M_local_buf[9] == 'f') || (s.field_2._M_local_buf[9] == 'F')) {
        std::istream::read((char *)input,(long)((long)&s.field_2 + 10));
        local_21a = false;
        std::any::operator=(v,&local_21a);
        s.field_2._M_local_buf[0xf] = '\x01';
      }
      else if ((s.field_2._M_local_buf[9] == 'n') || (s.field_2._M_local_buf[9] == 'N')) {
        std::istream::read((char *)input,(long)((long)&s.field_2 + 10));
        local_228 = (void *)0x0;
        std::any::operator=(v,&local_228);
        s.field_2._M_local_buf[0xf] = '\x01';
      }
    }
    else {
      str_number.field_2._M_local_buf[0xb] = s.field_2._M_local_buf[9] == '-';
      std::__cxx11::string::string(local_70);
      std::__cxx11::string::operator+=(local_70,s.field_2._M_local_buf[9]);
      std::istream::seekg((long)input,_S_cur);
      bVar1 = false;
      bVar2 = false;
      while( true ) {
        local_241 = 0;
        if (!bVar1) {
          local_241 = std::ios::good();
        }
        if ((local_241 & 1) == 0) break;
        s.field_2._M_local_buf[9] = std::istream::peek();
        if (s.field_2._M_local_buf[9] == '.') {
          bVar2 = true;
        }
        iVar3 = isdigit((int)s.field_2._M_local_buf[9]);
        if (((((iVar3 == 0) && (s.field_2._M_local_buf[9] != '.')) &&
             (s.field_2._M_local_buf[9] != 'e')) &&
            ((s.field_2._M_local_buf[9] != 'E' && (s.field_2._M_local_buf[9] != '-')))) &&
           (s.field_2._M_local_buf[9] != '+')) {
          bVar1 = true;
        }
        else {
          std::__cxx11::string::operator+=(local_70,s.field_2._M_local_buf[9]);
          std::istream::seekg((long)input,_S_cur);
        }
      }
      _Var4 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream((stringstream *)&tmp,local_70,_Var4);
      if (bVar2) {
        std::istream::operator>>(&tmp,(double *)&tmp_1);
        std::any::operator=(v,(double *)&tmp_1);
      }
      else if ((str_number.field_2._M_local_buf[0xb] & 1U) == 0) {
        std::istream::operator>>(&tmp,&local_218);
        std::any::operator=(v,&local_218);
      }
      else {
        std::istream::operator>>(&tmp,(long *)&tmp_2);
        std::any::operator=(v,(long *)&tmp_2);
      }
      s.field_2._M_local_buf[0xf] = '\x01';
      std::__cxx11::stringstream::~stringstream((stringstream *)&tmp);
      std::__cxx11::string::~string(local_70);
    }
  }
  return (bool)(s.field_2._M_local_buf[0xf] & 1);
}

Assistant:

bool json::deserialize(std::istream& input, any& v)
  {
    bool ret = false;

    char drain[5];

    strip_white_space(input);

    char c = (char)input.peek();
    if (c == '{')
    {
      ret = parse_object(input, v);
    }
    else if (c == '[')
    {
      ret = parse_array(input, v);
    }
    else if (c == '"')
    {
      std::string s;
      ret = read_string(input, s);
      v = std::move(s);
    }
    else if (isdigit(c) || c == '-')
    {
      bool is_signed = (c == '-');

      std::string str_number;
      str_number += c;
      input.seekg(1, std::ios::cur);
      bool done = false;
      bool found_period = false;
      while (!done && input.good())
      {
        c = (char)input.peek();

        if (c == '.')
          found_period = true;

        if (isdigit(c) || c == '.' || c == 'e' || c == 'E' || c == '-' || c == '+')
        {
          str_number += c;
          input.seekg(1, std::ios::cur);
        }
        else
        {
          done = true;
        }
      }

      std::stringstream ss(str_number);
      if (found_period)
      {
        double tmp;
        ss >> tmp;
        v = (tmp);
      }
      else if (is_signed)
      {
        std::int64_t tmp;
        ss >> tmp;
        v = (tmp);
      }
      else
      {
        std::uint64_t tmp;
        ss >> tmp;
        v = (tmp);
      }

      ret = true;
    }
    else if (c == 't' || c == 'T')
    {
      input.read(drain, 4);
      v = (true);
      ret = true;
    }
    else if (c == 'f' || c == 'F')
    {
      input.read(drain, 5);
      v = (false);
      ret = true;
    }
    else if (c == 'n' || c == 'N')
    {
      input.read(drain, 4);
      v = (nullptr);
      ret = true;
    }

    return ret;
  }